

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::compiles5cr(json_service *this,object *f)

{
  bool bVar1;
  double *pdVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ostringstream oss;
  map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  bool local_259;
  string local_238 [32];
  ostringstream local_218 [383];
  byte local_99;
  _Base_ptr local_68;
  _Self local_60 [9];
  _Self local_18 [3];
  
  cppcms::string_key::string_key
            ((string_key *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78);
  local_99 = 0;
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
       ::find(in_stack_fffffffffffffd48,(key_type *)0x11fce4);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
       ::end(in_stack_fffffffffffffd48);
  bVar1 = std::operator!=(local_18,local_60);
  local_259 = false;
  if (bVar1) {
    cppcms::string_key::string_key
              ((string_key *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
    local_99 = 1;
    local_68 = (_Base_ptr)
               std::
               map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
               ::find(in_stack_fffffffffffffd48,(key_type *)0x11fd71);
    std::_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>::
    operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_> *
               )0x11fd92);
    pdVar2 = (double *)cppcms::json::value::number();
    local_259 = *pdVar2 == 1.0;
  }
  if ((local_99 & 1) != 0) {
    cppcms::string_key::~string_key((string_key *)0x11fde7);
  }
  cppcms::string_key::~string_key((string_key *)0x11fdf4);
  if ((local_259 & 1U) != 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_218);
  poVar3 = std::operator<<((ostream *)local_218,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x57);
  std::operator<<(poVar3," f.find(\"member\")!=f.end() && f.find(\"member\")->second.number()==1");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_238);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles5cr(cppcms::json::object const &f) { TEST(f.find("member")!=f.end() && f.find("member")->second.number()==1); }